

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putil.cpp
# Opt level: O1

void u_versionToString_63(uint8_t *versionArray,char *versionString)

{
  char cVar1;
  ushort uVar2;
  byte bVar3;
  ushort uVar4;
  ulong uVar5;
  
  if (versionString != (char *)0x0) {
    if (versionArray != (uint8_t *)0x0) {
      uVar5 = 4;
      do {
        uVar4 = (ushort)uVar5;
        if (versionArray[uVar5 - 1] != '\0') goto LAB_0029bff0;
        uVar5 = (ulong)(ushort)(uVar4 - 1);
      } while ((ushort)(uVar4 - 1) != 0);
      uVar4 = 0;
LAB_0029bff0:
      uVar2 = 2;
      if (2 < uVar4) {
        uVar2 = uVar4;
      }
      bVar3 = *versionArray;
      if (99 < bVar3) {
        cVar1 = (char)((uint)bVar3 * 0x29 >> 0xc);
        *versionString = cVar1 + '0';
        versionString = versionString + 1;
        bVar3 = bVar3 + cVar1 * -100;
      }
      if (9 < bVar3) {
        *versionString = bVar3 / 10 | 0x30;
        versionString = (char *)((byte *)versionString + 1);
        bVar3 = bVar3 % 10;
      }
      *versionString = bVar3 | 0x30;
      uVar5 = 1;
      do {
        ((byte *)versionString)[1] = 0x2e;
        bVar3 = versionArray[uVar5];
        if (bVar3 < 100) {
          versionString = (char *)((byte *)versionString + 2);
        }
        else {
          cVar1 = (char)((uint)bVar3 * 0x29 >> 0xc);
          ((byte *)versionString)[2] = cVar1 + 0x30;
          versionString = (char *)((byte *)versionString + 3);
          bVar3 = bVar3 + cVar1 * -100;
        }
        if (9 < bVar3) {
          *versionString = bVar3 / 10 | 0x30;
          versionString = (char *)((byte *)versionString + 1);
          bVar3 = bVar3 % 10;
        }
        *versionString = bVar3 | 0x30;
        uVar5 = uVar5 + 1;
      } while (uVar2 != uVar5);
      versionString = (char *)((byte *)versionString + 1);
    }
    *versionString = 0;
  }
  return;
}

Assistant:

U_CAPI void U_EXPORT2
u_versionToString(const UVersionInfo versionArray, char *versionString) {
    uint16_t count, part;
    uint8_t field;

    if(versionString==NULL) {
        return;
    }

    if(versionArray==NULL) {
        versionString[0]=0;
        return;
    }

    /* count how many fields need to be written */
    for(count=4; count>0 && versionArray[count-1]==0; --count) {
    }

    if(count <= 1) {
        count = 2;
    }

    /* write the first part */
    /* write the decimal field value */
    field=versionArray[0];
    if(field>=100) {
        *versionString++=(char)('0'+field/100);
        field%=100;
    }
    if(field>=10) {
        *versionString++=(char)('0'+field/10);
        field%=10;
    }
    *versionString++=(char)('0'+field);

    /* write the following parts */
    for(part=1; part<count; ++part) {
        /* write a dot first */
        *versionString++=U_VERSION_DELIMITER;

        /* write the decimal field value */
        field=versionArray[part];
        if(field>=100) {
            *versionString++=(char)('0'+field/100);
            field%=100;
        }
        if(field>=10) {
            *versionString++=(char)('0'+field/10);
            field%=10;
        }
        *versionString++=(char)('0'+field);
    }

    /* NUL-terminate */
    *versionString=0;
}